

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_int64 sqlite3_soft_heap_limit64(sqlite3_int64 n)

{
  int iVar1;
  sqlite3_int64 sVar2;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
    sVar2 = mem0.alarmThreshold;
    if (n < 0) {
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
      }
    }
    else {
      mem0.alarmThreshold = n;
      if (mem0.hardLimit < n) {
        mem0.alarmThreshold = mem0.hardLimit;
      }
      if (n == 0) {
        mem0.alarmThreshold = mem0.hardLimit;
      }
      if (mem0.hardLimit < 1) {
        mem0.alarmThreshold = n;
      }
      mem0.nearlyFull =
           (int)(mem0.alarmThreshold <= sqlite3Stat.nowValue[0] && 0 < mem0.alarmThreshold);
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
      }
      sqlite3_memory_used();
    }
  }
  else {
    sVar2 = -1;
  }
  return sVar2;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_soft_heap_limit64(sqlite3_int64 n){
  sqlite3_int64 priorLimit;
  sqlite3_int64 excess;
  sqlite3_int64 nUsed;
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return -1;
#endif
  sqlite3_mutex_enter(mem0.mutex);
  priorLimit = mem0.alarmThreshold;
  if( n<0 ){
    sqlite3_mutex_leave(mem0.mutex);
    return priorLimit;
  }
  if( mem0.hardLimit>0 && (n>mem0.hardLimit || n==0) ){
    n = mem0.hardLimit;
  }
  mem0.alarmThreshold = n;
  nUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED);
  AtomicStore(&mem0.nearlyFull, n>0 && n<=nUsed);
  sqlite3_mutex_leave(mem0.mutex);
  excess = sqlite3_memory_used() - n;
  if( excess>0 ) sqlite3_release_memory((int)(excess & 0x7fffffff));
  return priorLimit;
}